

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

void __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::bt_impl
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,size_t N,size_t Wn)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  local_40;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  this->buffer = 0;
  this->leaves_count = 0;
  this->nodes_count = 0;
  this->size = 0;
  this->rank = 0;
  this->height = 0;
  this->free_node = 0;
  this->free_leaf = 0;
  this->capacity = 0;
  this->node_width = 0;
  this->counter_width = 0;
  this->pointer_width = 0;
  this->degree = 0;
  this->buffer = 0;
  this->leaves_count = 0;
  this->nodes_count = 0;
  auVar12 = in_ZMM1._0_16_;
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
  packed_view(&this->sizes);
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
  packed_view(&this->ranks);
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
  packed_view(&this->pointers);
  std::
  _Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ::_Deque_base(&(this->leaves).
                 super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
               );
  this->capacity = N;
  if (N < 0x1001) {
    this->leaves_count = 1;
    alloc_leaf(this);
  }
  else {
    auVar1 = vcvtusi2sd_avx512f(auVar12,N);
    this->node_width = Wn;
    auVar10._0_8_ = log2(auVar1._0_8_);
    auVar10._8_56_ = extraout_var;
    auVar1 = vroundsd_avx(auVar10._0_16_,auVar10._0_16_,9);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = auVar1._0_8_ + 1.0;
    lVar5 = vcvttsd2usi_avx512f(auVar9);
    this->counter_width = lVar5 + 1U;
    uVar2 = Wn / (lVar5 + 1U);
    auVar12 = vcvtusi2sd_avx512f(auVar12,uVar2);
    this->degree = uVar2;
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    auVar12 = vroundsd_avx(auVar12,auVar12,10);
    lVar5 = vcvttsd2usi_avx512f(auVar12);
    uVar3 = lVar5 + (ulong)(lVar5 == 0);
    do {
      uVar7 = uVar3;
      auVar12 = vcvtusi2sd_avx512f(in_XMM2,(uVar2 + 1) / uVar7);
      auVar1 = vcvtusi2sd_avx512f(in_XMM2,uVar7);
      uVar3 = uVar7 - 1;
    } while (auVar12._0_8_ < auVar1._0_8_);
    uVar8 = 0;
    uVar2 = uVar7 + 1;
    this->buffer = uVar7;
    auVar12 = vcvtusi2sd_avx512f(in_XMM2,N / (((0xfff - (uVar7 - 1)) * uVar7) / uVar2));
    lVar5 = vcvttsd2usi_avx512f(auVar12);
    uVar6 = lVar5 + 1;
    this->leaves_count = uVar6;
    this->nodes_count = 0;
    uVar3 = uVar6;
    do {
      uVar3 = (uVar3 / uVar7 + 1) - (ulong)(uVar3 % uVar7 == 0);
      uVar8 = uVar8 + uVar3;
    } while (1 < uVar3);
    uVar3 = uVar2;
    if (uVar2 < uVar6) {
      uVar3 = uVar6;
    }
    if (uVar2 < uVar8) {
      uVar2 = uVar8;
    }
    this->leaves_count = uVar3;
    this->nodes_count = uVar2;
    if (uVar2 < uVar6) {
      uVar2 = uVar3;
    }
    auVar12 = vcvtusi2sd_avx512f(in_XMM2,uVar2);
    auVar11._0_8_ = log2(auVar12._0_8_);
    auVar11._8_56_ = extraout_var_00;
    auVar12 = vroundsd_avx(auVar11._0_16_,auVar11._0_16_,10);
    sVar4 = vcvttsd2usi_avx512f(auVar12);
    this->pointer_width = sVar4;
    this->height = 1;
    alloc_node(this);
    alloc_leaf(this);
    sVar4 = alloc_leaf(this);
    local_40._index = 0;
    local_40._v = &this->pointers;
    item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=(&local_40,sVar4);
  }
  return;
}

Assistant:

bt_impl<W, AP>::bt_impl(size_t N, size_t Wn)
        {
            capacity = N;
            
            // When all the maximum capacity fits in a leaf, we act consequently
            if(small()) {
                // We only need one leaf
                leaves_count = 1;
                alloc_leaf();
                return;
            }
            
            node_width = Wn;
            
            // The + 1 at the end is for the extra flag bit
            counter_width = size_t(floor(log2(capacity)) + 1) + 1;
            
            degree = node_width / counter_width;
            
            for(buffer = max(size_t(ceil(sqrt(degree))), size_t(1));
                floor((degree + 1)/buffer) < buffer;
                --buffer);
            
            // Maximum number of leaves needed in the worst case
            leaves_count = size_t(ceil(capacity / ((buffer *
                                                    (leaf_bits - buffer))
                                                  / (buffer + 1))))
                           + 1; // for the sentinel leaf at index 0
            
            size_t minimum_degree = buffer;
            
            // Total number of internal nodes
            nodes_count = 0;
            size_t level_count = leaves_count;
            do
            {
                level_count = ceildiv(level_count, minimum_degree);
                nodes_count += level_count;
            } while(level_count > 1);
            
            // For values of small capacity relatively to the leaves and nodes
            // bit size, the buffer could be greater than the maximum count.
            leaves_count = max(leaves_count, buffer + 1);
            nodes_count = max(nodes_count, buffer + 1);
            
            // Width of pointers
            pointer_width = size_t(ceil(log2(max(nodes_count, leaves_count))));
            
            assert(pointer_width <= counter_width);
            assert(pointer_width * (degree + 1) <= node_width);
            
            // Allocate all the needed memory ahead of time if the policy says so
            if(AP == alloc_immediatly) {
                reserve_nodes(nodes_count);
                leaves.resize(leaves_count);
            }
            
            // Allocate space for the root node and its first leaf
            height = 1; // Initial height is 1
            alloc_node(); // Initial root node
            alloc_leaf(); // Sentinel leaf for position zero
            root().pointers(0) = alloc_leaf(); // First leaf
        }